

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MFInterpolater.cpp
# Opt level: O2

Box * __thiscall
amrex::MFCellBilinear::CoarseBox
          (Box *__return_storage_ptr__,MFCellBilinear *this,Box *fine,IntVect *ratio)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  int i;
  uint uVar7;
  uint uVar8;
  int dir;
  long lVar9;
  uint uVar10;
  int local_14 [3];
  
  uVar4 = *(undefined8 *)(fine->smallend).vect;
  uVar5 = *(undefined8 *)((fine->smallend).vect + 2);
  uVar6 = *(undefined8 *)((fine->bigend).vect + 2);
  *(undefined8 *)(__return_storage_ptr__->bigend).vect = *(undefined8 *)(fine->bigend).vect;
  *(undefined8 *)((__return_storage_ptr__->bigend).vect + 2) = uVar6;
  *(undefined8 *)(__return_storage_ptr__->smallend).vect = uVar4;
  *(undefined8 *)((__return_storage_ptr__->smallend).vect + 2) = uVar5;
  iVar1 = ratio->vect[0];
  iVar2 = ratio->vect[1];
  if (iVar2 == 1 && iVar1 == 1) {
    if (ratio->vect[2] == 1) goto LAB_0054bb9a;
    uVar7 = (__return_storage_ptr__->smallend).vect[1];
  }
  else {
    uVar7 = (__return_storage_ptr__->smallend).vect[0];
    if (iVar1 != 1) {
      if (iVar1 == 4) {
        if ((int)uVar7 < 0) {
          uVar7 = (int)uVar7 >> 2;
        }
        else {
          uVar7 = uVar7 >> 2;
        }
      }
      else if (iVar1 == 2) {
        if ((int)uVar7 < 0) {
          uVar7 = (int)uVar7 >> 1;
        }
        else {
          uVar7 = uVar7 >> 1;
        }
      }
      else if ((int)uVar7 < 0) {
        uVar7 = ~((int)~uVar7 / iVar1);
      }
      else {
        uVar7 = (int)uVar7 / iVar1;
      }
    }
    (__return_storage_ptr__->smallend).vect[0] = uVar7;
    uVar7 = (__return_storage_ptr__->smallend).vect[1];
    if (iVar2 != 1) {
      if (iVar2 == 4) {
        if ((int)uVar7 < 0) {
          uVar7 = (int)uVar7 >> 2;
        }
        else {
          uVar7 = uVar7 >> 2;
        }
      }
      else if (iVar2 == 2) {
        if ((int)uVar7 < 0) {
          uVar7 = (int)uVar7 >> 1;
        }
        else {
          uVar7 = uVar7 >> 1;
        }
      }
      else if ((int)uVar7 < 0) {
        uVar7 = ~((int)~uVar7 / iVar2);
      }
      else {
        uVar7 = (int)uVar7 / iVar2;
      }
    }
  }
  (__return_storage_ptr__->smallend).vect[1] = uVar7;
  uVar7 = (__return_storage_ptr__->smallend).vect[2];
  iVar3 = ratio->vect[2];
  if (iVar3 != 1) {
    if (iVar3 == 4) {
      if ((int)uVar7 < 0) {
        uVar7 = (int)uVar7 >> 2;
      }
      else {
        uVar7 = uVar7 >> 2;
      }
    }
    else if (iVar3 == 2) {
      if ((int)uVar7 < 0) {
        uVar7 = (int)uVar7 >> 1;
      }
      else {
        uVar7 = uVar7 >> 1;
      }
    }
    else if ((int)uVar7 < 0) {
      uVar7 = ~((int)~uVar7 / iVar3);
    }
    else {
      uVar7 = (int)uVar7 / iVar3;
    }
  }
  (__return_storage_ptr__->smallend).vect[2] = uVar7;
  uVar7 = (__return_storage_ptr__->btype).itype;
  if (uVar7 == 0) {
    uVar7 = (__return_storage_ptr__->bigend).vect[0];
    if (iVar1 != 1) {
      if (iVar1 == 4) {
        if ((int)uVar7 < 0) {
          uVar7 = (int)uVar7 >> 2;
        }
        else {
          uVar7 = uVar7 >> 2;
        }
      }
      else if (iVar1 == 2) {
        if ((int)uVar7 < 0) {
          uVar7 = (int)uVar7 >> 1;
        }
        else {
          uVar7 = uVar7 >> 1;
        }
      }
      else if ((int)uVar7 < 0) {
        uVar7 = ~((int)~uVar7 / iVar1);
      }
      else {
        uVar7 = (int)uVar7 / iVar1;
      }
    }
    (__return_storage_ptr__->bigend).vect[0] = uVar7;
    uVar7 = (__return_storage_ptr__->bigend).vect[1];
    if (iVar2 != 1) {
      if (iVar2 == 4) {
        if ((int)uVar7 < 0) {
          uVar7 = (int)uVar7 >> 2;
        }
        else {
          uVar7 = uVar7 >> 2;
        }
      }
      else if (iVar2 == 2) {
        if ((int)uVar7 < 0) {
          uVar7 = (int)uVar7 >> 1;
        }
        else {
          uVar7 = uVar7 >> 1;
        }
      }
      else if ((int)uVar7 < 0) {
        uVar7 = ~((int)~uVar7 / iVar2);
      }
      else {
        uVar7 = (int)uVar7 / iVar2;
      }
    }
    (__return_storage_ptr__->bigend).vect[1] = uVar7;
    uVar7 = (__return_storage_ptr__->bigend).vect[2];
    if (iVar3 != 1) {
      if (iVar3 == 4) {
        if ((int)uVar7 < 0) {
          uVar7 = (int)uVar7 >> 2;
        }
        else {
          uVar7 = uVar7 >> 2;
        }
      }
      else if (iVar3 == 2) {
        if ((int)uVar7 < 0) {
          uVar7 = (int)uVar7 >> 1;
        }
        else {
          uVar7 = uVar7 >> 1;
        }
      }
      else if ((int)uVar7 < 0) {
        uVar7 = ~((int)~uVar7 / iVar3);
      }
      else {
        uVar7 = (int)uVar7 / iVar3;
      }
    }
    (__return_storage_ptr__->bigend).vect[2] = uVar7;
  }
  else {
    local_14[0] = 0;
    local_14[1] = 0;
    local_14[2] = 0;
    for (lVar9 = 0; lVar9 != 3; lVar9 = lVar9 + 1) {
      if (((uVar7 >> ((uint)lVar9 & 0x1f) & 1) != 0) &&
         ((__return_storage_ptr__->bigend).vect[lVar9] % ratio->vect[lVar9] != 0)) {
        local_14[lVar9] = 1;
      }
    }
    uVar7 = (__return_storage_ptr__->bigend).vect[0];
    if (iVar1 != 1) {
      if (iVar1 == 4) {
        if ((int)uVar7 < 0) {
          uVar7 = (int)uVar7 >> 2;
        }
        else {
          uVar7 = uVar7 >> 2;
        }
      }
      else if (iVar1 == 2) {
        if ((int)uVar7 < 0) {
          uVar7 = (int)uVar7 >> 1;
        }
        else {
          uVar7 = uVar7 >> 1;
        }
      }
      else if ((int)uVar7 < 0) {
        uVar7 = ~((int)~uVar7 / iVar1);
      }
      else {
        uVar7 = (int)uVar7 / iVar1;
      }
    }
    uVar10 = (__return_storage_ptr__->bigend).vect[1];
    if (iVar2 != 1) {
      if (iVar2 == 4) {
        if ((int)uVar10 < 0) {
          uVar10 = (int)uVar10 >> 2;
        }
        else {
          uVar10 = uVar10 >> 2;
        }
      }
      else if (iVar2 == 2) {
        if ((int)uVar10 < 0) {
          uVar10 = (int)uVar10 >> 1;
        }
        else {
          uVar10 = uVar10 >> 1;
        }
      }
      else if ((int)uVar10 < 0) {
        uVar10 = ~((int)~uVar10 / iVar2);
      }
      else {
        uVar10 = (int)uVar10 / iVar2;
      }
    }
    uVar8 = (__return_storage_ptr__->bigend).vect[2];
    if (iVar3 != 1) {
      if (iVar3 == 4) {
        if ((int)uVar8 < 0) {
          uVar8 = (int)uVar8 >> 2;
        }
        else {
          uVar8 = uVar8 >> 2;
        }
      }
      else if (iVar3 == 2) {
        if ((int)uVar8 < 0) {
          uVar8 = (int)uVar8 >> 1;
        }
        else {
          uVar8 = uVar8 >> 1;
        }
      }
      else if ((int)uVar8 < 0) {
        uVar8 = ~((int)~uVar8 / iVar3);
      }
      else {
        uVar8 = (int)uVar8 / iVar3;
      }
    }
    (__return_storage_ptr__->bigend).vect[0] = uVar7 + local_14[0];
    (__return_storage_ptr__->bigend).vect[1] = uVar10 + local_14[1];
    (__return_storage_ptr__->bigend).vect[2] = uVar8 + local_14[2];
  }
LAB_0054bb9a:
  for (lVar9 = 0; lVar9 != 3; lVar9 = lVar9 + 1) {
    iVar1 = (__return_storage_ptr__->smallend).vect[lVar9];
    iVar2 = ratio->vect[lVar9];
    if (((fine->smallend).vect[lVar9] - iVar2 * iVar1) * 2 < iVar2) {
      (__return_storage_ptr__->smallend).vect[lVar9] = iVar1 + -1;
    }
    iVar1 = (__return_storage_ptr__->bigend).vect[lVar9];
    if (iVar2 <= ((fine->bigend).vect[lVar9] - iVar1 * iVar2) * 2) {
      (__return_storage_ptr__->bigend).vect[lVar9] = iVar1 + 1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Box
MFCellBilinear::CoarseBox (const Box& fine, const IntVect& ratio)
{
    const int* lo = fine.loVect();
    const int* hi = fine.hiVect();

    Box crse(amrex::coarsen(fine,ratio));
    const int* clo = crse.loVect();
    const int* chi = crse.hiVect();

    for (int i = 0; i < AMREX_SPACEDIM; i++) {
        if ((lo[i]-clo[i]*ratio[i])*2 < ratio[i]) {
            crse.growLo(i,1);
        }
        if ((hi[i]-chi[i]*ratio[i])*2 >= ratio[i]) {
            crse.growHi(i,1);
        }
    }
    return crse;
}